

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void callFinaliser(sqlite3 *db,int offset)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  int in_ESI;
  long in_RDI;
  _func_int_sqlite3_vtab_ptr *x;
  sqlite3_vtab *p;
  VTable *pVTab;
  VTable **aVTrans;
  int i;
  void *in_stack_ffffffffffffffc8;
  sqlite3 *in_stack_ffffffffffffffd0;
  int local_10;
  
  if (*(long *)(in_RDI + 0x240) != 0) {
    lVar1 = *(long *)(in_RDI + 0x240);
    *(undefined8 *)(in_RDI + 0x240) = 0;
    for (local_10 = 0; local_10 < *(int *)(in_RDI + 0x21c); local_10 = local_10 + 1) {
      lVar2 = *(long *)(lVar1 + (long)local_10 * 8);
      plVar3 = *(long **)(lVar2 + 0x10);
      if ((plVar3 != (long *)0x0) &&
         (in_stack_ffffffffffffffd0 = *(sqlite3 **)(*plVar3 + (long)in_ESI),
         in_stack_ffffffffffffffd0 != (sqlite3 *)0x0)) {
        (*(code *)in_stack_ffffffffffffffd0)(plVar3);
      }
      *(undefined4 *)(lVar2 + 0x20) = 0;
      sqlite3VtabUnlock((VTable *)in_stack_ffffffffffffffd0);
    }
    sqlite3DbFree(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    *(undefined4 *)(in_RDI + 0x21c) = 0;
  }
  return;
}

Assistant:

static void callFinaliser(sqlite3 *db, int offset){
  int i;
  if( db->aVTrans ){
    VTable **aVTrans = db->aVTrans;
    db->aVTrans = 0;
    for(i=0; i<db->nVTrans; i++){
      VTable *pVTab = aVTrans[i];
      sqlite3_vtab *p = pVTab->pVtab;
      if( p ){
        int (*x)(sqlite3_vtab *);
        x = *(int (**)(sqlite3_vtab *))((char *)p->pModule + offset);
        if( x ) x(p);
      }
      pVTab->iSavepoint = 0;
      sqlite3VtabUnlock(pVTab);
    }
    sqlite3DbFree(db, aVTrans);
    db->nVTrans = 0;
  }
}